

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_exception(TCGContext_conflict12 *tcg_ctx,int excp)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  pTVar1 = tcg_const_i32_s390x(tcg_ctx,excp);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_exception,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_exception(DisasContext *s, int trapno, target_ulong cur_eip)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    gen_update_cc_op(s);
    gen_jmp_im(s, cur_eip);
    gen_helper_raise_exception(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, trapno));
    s->base.is_jmp = DISAS_NORETURN;
}